

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall
stackjit::ExecutionEngine::loadImage
          (ExecutionEngine *this,AssemblyImage *image,AssemblyType assemblyType)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  Function *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  runtime_error *prVar5;
  long *plVar6;
  long *plVar7;
  PrimitiveTypes primitiveType;
  bool bVar8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (assemblyType == Program) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"main","");
    this_00 = getFunction(image,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (this_00 == (Function *)0x0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"The main function must be defined.");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = Loader::Function::parameters_abi_cxx11_(this_00);
    pbVar1 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = true;
    if (pbVar2 == pbVar1) {
      Loader::Function::returnType_abi_cxx11_(&local_d0,this_00);
      TypeSystem::toString_abi_cxx11_(&local_b0,(TypeSystem *)0x1,primitiveType);
      if (local_d0._M_string_length == local_b0._M_string_length) {
        if (local_d0._M_string_length == 0) {
          bVar8 = false;
        }
        else {
          iVar3 = bcmp(local_d0._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_d0._M_string_length
                      );
          bVar8 = iVar3 != 0;
        }
      }
    }
    if (pbVar2 == pbVar1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    if (bVar8) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      Loader::Function::toString_abi_cxx11_(&local_70,this_00);
      std::operator+(&local_50,
                     "The main function must have the signature: \'main() Int\' but got \'",
                     &local_70);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_f0 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (local_f0 == plVar7) {
        local_e0 = *plVar7;
        lStack_d8 = plVar6[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar7;
      }
      local_e8 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::runtime_error::runtime_error(prVar5,(string *)&local_f0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  ImageContainer::addImage(&this->mImageContainer,image);
  return;
}

Assistant:

void ExecutionEngine::loadImage(AssemblyImage* image, AssemblyType assemblyType) {
		if (assemblyType == AssemblyType::Program) {
			auto mainFunc = getFunction(*image, "main");

			if (mainFunc != nullptr) {
				if (!(mainFunc->parameters().size() == 0
					  && mainFunc->returnType() == TypeSystem::toString(PrimitiveTypes::Integer))) {
					throw std::runtime_error("The main function must have the signature: 'main() Int' but got '" + mainFunc->toString() + "'.");
				}
			} else {
				throw std::runtime_error("The main function must be defined.");
			}
		}

		mImageContainer.addImage(image);
	}